

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

optional<unsigned_int> *
tinyusdz::value::TryGetUnderlyingTypeId
          (optional<unsigned_int> *__return_storage_ptr__,string *tyname)

{
  bool bVar1;
  char *data;
  value_type *pvVar2;
  optional<unsigned_int> local_2e8;
  uint local_2e0;
  uint local_2dc;
  iterator<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>_>
  local_2d8;
  string local_2d0;
  iterator<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>_>
  local_2c8;
  const_iterator ret;
  string local_2b8;
  string local_298;
  allocator local_271;
  string local_270;
  uint local_24c;
  undefined1 local_248 [4];
  uint32_t array_bit;
  string s;
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
  utyidmap;
  string *tyname_local;
  
  memcpy((void *)((long)&s.field_2 + 8),&PTR_anon_var_dwarf_30ae9e_0039fa38,0x210);
  std::__cxx11::string::string((string *)local_248,(string *)tyname);
  local_24c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"[]",&local_271);
  bVar1 = endsWith(tyname,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"[]",(allocator *)((long)&ret.pos + 7));
    removeSuffix(&local_298,(string *)local_248,&local_2b8);
    std::__cxx11::string::operator=((string *)local_248,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ret.pos + 7));
    local_24c = local_24c | 0x100000;
  }
  data = (char *)std::__cxx11::string::c_str();
  mapbox::eternal::string::string(&local_2d0,data);
  local_2c8.pos =
       (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *)
       mapbox::eternal::impl::
       map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
       ::find((map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
               *)((long)&s.field_2 + 8),&local_2d0);
  local_2d8.pos =
       (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *)
       mapbox::eternal::impl::
       map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
       ::end((map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
              *)((long)&s.field_2 + 8));
  bVar1 = mapbox::eternal::
          iterator<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>_>
          ::operator!=(&local_2c8,&local_2d8);
  if (bVar1) {
    pvVar2 = mapbox::eternal::
             iterator<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>_>
             ::operator->(&local_2c8);
    local_2dc = pvVar2->second | local_24c;
    nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>
              (__return_storage_ptr__,&local_2dc);
  }
  local_2e0 = (uint)bVar1;
  std::__cxx11::string::~string((string *)local_248);
  if (local_2e0 == 0) {
    TryGetTypeId(&local_2e8,tyname);
    nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>
              (__return_storage_ptr__,&local_2e8);
    nonstd::optional_lite::optional<unsigned_int>::~optional(&local_2e8);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<uint32_t> TryGetUnderlyingTypeId(const std::string &tyname) {
  MAPBOX_ETERNAL_CONSTEXPR const auto utyidmap =
      mapbox::eternal::hash_map<mapbox::eternal::string, uint32_t>({
        {kPoint3h, TYPE_ID_HALF3},
        {kPoint3f, TYPE_ID_FLOAT3},
        {kPoint3d, TYPE_ID_DOUBLE3},
        {kNormal3h, TYPE_ID_HALF3},
        {kNormal3f, TYPE_ID_FLOAT3},
        {kNormal3d, TYPE_ID_DOUBLE3},
        {kVector3h, TYPE_ID_HALF3},
        {kVector3f, TYPE_ID_FLOAT3},
        {kVector3d, TYPE_ID_DOUBLE3},
        {kColor3h, TYPE_ID_HALF3},
        {kColor3f, TYPE_ID_FLOAT3},
        {kColor3d, TYPE_ID_DOUBLE3},
        {kColor4h, TYPE_ID_HALF4},
        {kColor4f, TYPE_ID_FLOAT4},
        {kColor4d, TYPE_ID_DOUBLE4},
        {kTexCoord2h, TYPE_ID_HALF2},
        {kTexCoord2f, TYPE_ID_FLOAT2},
        {kTexCoord2d, TYPE_ID_DOUBLE3},
        {kTexCoord3h, TYPE_ID_HALF3},
        {kTexCoord3f, TYPE_ID_FLOAT3},
        {kTexCoord3d, TYPE_ID_DOUBLE4},
        {kFrame4d, TYPE_ID_MATRIX4D},
  });

  {
    std::string s = tyname;
    uint32_t array_bit = 0;
    if (endsWith(tyname, "[]")) {
      s = removeSuffix(s, "[]");
      array_bit |= TYPE_ID_1D_ARRAY_BIT;
    }

    auto ret = utyidmap.find(s.c_str());
    if (ret != utyidmap.end()) {
      return ret->second | array_bit;
    }
  }

  // Fallback
  return TryGetTypeId(tyname);
}